

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileDisposal.cpp
# Opt level: O2

void printPdb(Particle *particle)

{
  double *pdVar1;
  char *pcVar2;
  FILE *__stream;
  ulong uVar3;
  char *pcVar4;
  ostream *poVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  pcVar2 = catStrIntStr(energyFileAddress,"tempFile/temp",particle->index,".pdb");
  __stream = fopen(pcVar2,"w");
  if (__stream != (FILE *)0x0) {
    uVar8 = 0;
    uVar3 = (ulong)(uint)particle->numAA;
    if (particle->numAA < 1) {
      uVar3 = uVar8;
    }
    uVar7 = 4;
    uVar6 = 0;
    for (; uVar3 * 0x60 != uVar8; uVar8 = uVar8 + 0x60) {
      pcVar4 = getRelativeAA(particle->seq[uVar6]);
      uVar6 = uVar6 + 1;
      pdVar1 = particle->addO_origin;
      fprintf(__stream,"ATOM   %4d  N   %3s   %3d    %8.3f%8.3f%8.3f  1.00  0.00\n",
              *(undefined8 *)((long)pdVar1 + uVar8),*(undefined8 *)((long)pdVar1 + uVar8 + 8),
              *(undefined8 *)((long)pdVar1 + uVar8 + 0x10),(ulong)(uVar7 - 3),pcVar4,
              uVar6 & 0xffffffff);
      pdVar1 = particle->addO_origin;
      fprintf(__stream,"ATOM   %4d  CA  %3s   %3d    %8.3f%8.3f%8.3f  1.00  0.00\n",
              *(undefined8 *)((long)pdVar1 + uVar8 + 0x18),
              *(undefined8 *)((long)pdVar1 + uVar8 + 0x20),
              *(undefined8 *)((long)pdVar1 + uVar8 + 0x28),(ulong)(uVar7 - 2),pcVar4,
              uVar6 & 0xffffffff);
      pdVar1 = particle->addO_origin;
      fprintf(__stream,"ATOM   %4d  C   %3s   %3d    %8.3f%8.3f%8.3f  1.00  0.00\n",
              *(undefined8 *)((long)pdVar1 + uVar8 + 0x30),
              *(undefined8 *)((long)pdVar1 + uVar8 + 0x38),
              *(undefined8 *)((long)pdVar1 + uVar8 + 0x40),(ulong)(uVar7 - 1),pcVar4,
              uVar6 & 0xffffffff);
      pdVar1 = particle->addO_origin;
      fprintf(__stream,"ATOM   %4d  O   %3s   %3d    %8.3f%8.3f%8.3f  1.00  0.00\n",
              *(undefined8 *)((long)pdVar1 + uVar8 + 0x48),
              *(undefined8 *)((long)pdVar1 + uVar8 + 0x50),
              *(undefined8 *)((long)pdVar1 + uVar8 + 0x58),(ulong)uVar7,pcVar4,uVar6 & 0xffffffff);
      operator_delete(pcVar4);
      uVar7 = uVar7 + 4;
    }
    fclose(__stream);
    pcVar4 = catStrIntStr(energyFileAddress,"tempFile/temp_",particle->index,".pdb");
    pcVar2 = catStrStr(refine_1Address,"scrwl4/Scwrl4 -i ",pcVar2," -o ",pcVar4);
    system(pcVar2);
    return;
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"Can\'t write temp.pdb");
  std::endl<char,std::char_traits<char>>(poVar5);
  exit(-1);
}

Assistant:

void printPdb(Particle * particle){
    FILE * output;
    //cout << "index= " << particle->index << endl;
    //const char *fileName = catStrIntStr("/home/ws/zzZyj/data/energyFile/tempFile/temp", particle->index, ".pdb");
    const char *fileName = catStrIntStr(energyFileAddress,"tempFile/temp", particle->index, ".pdb");
    output = fopen(fileName, "w");
    if (output == NULL) {
        cout << "Can't write temp.pdb" << endl;
        exit(-1);
    }
    int lenOfAA = particle->numAA;
    for (int i=0; i<lenOfAA; i++){
        char *AA = getRelativeAA(particle->seq[i]);
        int k1 = i*4*3, k2 = i*4*3+3, k3 = i*4*3+6, k4 = i*4*3+9;
        fprintf(output, "ATOM   %4d  N   %3s   %3d    %8.3f%8.3f%8.3f  1.00  0.00\n",
                4*i+1, AA, i+1, particle->addO_origin[k1], particle->addO_origin[k1+1], particle->addO_origin[k1+2]);
        fprintf(output, "ATOM   %4d  CA  %3s   %3d    %8.3f%8.3f%8.3f  1.00  0.00\n",
                4*i+2, AA, i+1, particle->addO_origin[k2], particle->addO_origin[k2+1], particle->addO_origin[k2+2]);
        fprintf(output, "ATOM   %4d  C   %3s   %3d    %8.3f%8.3f%8.3f  1.00  0.00\n",
                4*i+3, AA, i+1, particle->addO_origin[k3], particle->addO_origin[k3+1], particle->addO_origin[k3+2]);
        fprintf(output, "ATOM   %4d  O   %3s   %3d    %8.3f%8.3f%8.3f  1.00  0.00\n",
                4*i+4, AA, i+1, particle->addO_origin[k4], particle->addO_origin[k4+1], particle->addO_origin[k4+2]);
        delete AA;
    }
    fclose(output);
    //system("/home/ws/GL/refine1/scrwl4/Scwrl4 -i /home/ws/zzZyj/data/temp.pdb -o /home/ws/zzZyj/data/temp1.pdb");
    //const char *newFile = catStrIntStr("/home/ws/zzZyj/data/energyFile/tempFile/temp_", particle->index, ".pdb");
    const char *newFile = catStrIntStr(energyFileAddress,"tempFile/temp_", particle->index, ".pdb");
    const char *command = catStrStr(refine_1Address, "scrwl4/Scwrl4 -i ", fileName,
                                    " -o ", newFile);
    system(command);
}